

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfwsound.c
# Opt level: O2

uint8_t * MMFWSoundEntry_AForEntry(MMFW *mmfw,int i)

{
  uint8_t *dest;
  
  fseek((FILE *)mmfw->fp,mmfw->kind_metadata_start_pos,0);
  fseek((FILE *)mmfw->fp,(long)i << 2,1);
  dest = (uint8_t *)calloc(4,1);
  ReadUint8(mmfw->fp,1,dest);
  ReadUint8(mmfw->fp,1,dest + 1);
  ReadUint8(mmfw->fp,1,dest + 2);
  ReadUint8(mmfw->fp,1,dest + 3);
  return dest;
}

Assistant:

uint8_t *
MMFWSoundEntry_AForEntry(MMFW *mmfw, int i)
{
	fseek(mmfw->fp, mmfw->kind_metadata_start_pos, SEEK_SET);
	fseek(mmfw->fp, i*sizeof(uint32_t), SEEK_CUR);
	uint8_t *result = calloc(4, 1);
	ReadUint8(mmfw->fp, 1, &result[0]);
	ReadUint8(mmfw->fp, 1, &result[1]);
	ReadUint8(mmfw->fp, 1, &result[2]);
	ReadUint8(mmfw->fp, 1, &result[3]);
	return result;
}